

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto3Type> field,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  int *piVar1;
  int iVar2;
  uint8_t *puVar3;
  StringOutputStream *this;
  _Alloc_hider _Var4;
  undefined4 uVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  Status SVar9;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar10;
  int64_t iVar11;
  byte *pbVar12;
  uintptr_t extraout_RAX;
  undefined8 uVar13;
  Msg *in_RCX;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  char *in_R8;
  Status *_status;
  string_view literal;
  string_view url;
  string_view literal_00;
  string_view literal_01;
  string_view x;
  string out;
  StringOutputStream stream;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  string local_1b0;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_190;
  Msg<google::protobuf::json_internal::ParseProto3Type> *local_188;
  Msg<google::protobuf::json_internal::ParseProto3Type> *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [40];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_130;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_128 [6];
  undefined1 local_f8 [32];
  HeapOrSoo local_d8;
  ZeroCopyInputStream local_c8 [6];
  uint8_t *local_98;
  int local_90;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_88;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_68;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  
  JsonLexer::PeekKind((JsonLexer *)&local_d8.heap);
  uVar13 = local_d8.heap.control;
  uVar5 = local_d8._8_4_;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_d8.heap);
  if (((ctrl_t *)uVar13 == (ctrl_t *)0x1) && (uVar5 == 6)) {
    SVar9 = JsonLexer::Expect(lex,field,4,"null");
    return (Status)SVar9.rep_;
  }
  local_158._0_8_ = (_func_int **)0x0;
  local_158._8_8_ = (string *)0x0;
  local_158._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    iVar2 = *(int *)((long)&field[2].parent_ + 4);
    if (iVar2 == 0) {
      JsonLocation::Invalid((JsonLocation *)lex,field + 3,0x22,"JSON content was too deeply nested")
      ;
      if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c5590;
    }
    else {
      *(int *)((long)&field[2].parent_ + 4) = iVar2 + -1;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar6 = JsonLexer::Peek((JsonLexer *)field,literal);
    if (bVar6) {
      piVar1 = (int *)((long)&field[2].parent_ + 4);
      *piVar1 = *piVar1 + 1;
LAB_002c5095:
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    else {
      this = (StringOutputStream *)(local_178 + 0x10);
      do {
        JsonLexer::SkipToToken(lex);
        if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c5590;
        absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&local_130.status_);
        cVar7 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
        if ((cVar7 != '\"') &&
           (cVar7 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field), cVar7 != '\''
           )) {
          if (*(char *)&field[2].type_ == '\x01') {
            JsonLexer::ParseBareWord
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&local_d8.heap,(JsonLexer *)field);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_130.status_,
                        (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_d8.heap);
            goto LAB_002c512a;
          }
          JsonLocation::Invalid((JsonLocation *)lex,field + 3,0xc,"expected \'\"\'");
LAB_002c5583:
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_130.status_);
          goto LAB_002c5590;
        }
        JsonLexer::ParseUtf8
                  ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&local_d8.heap,(JsonLexer *)field);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_130.status_,
                    (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_d8.heap);
LAB_002c512a:
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_d8.heap);
        (lex->stream_).stream_ = (ZeroCopyInputStream *)local_130;
        aVar10 = local_130;
        if (((ulong)local_130 & 1) == 0) {
          LOCK();
          *(int *)&((ThreadSafeArena *)local_130)->tag_and_id_ =
               *(int *)&((ThreadSafeArena *)local_130)->tag_and_id_ + 1;
          UNLOCK();
          aVar10.status_.rep_ = (Status)(lex->stream_).stream_;
        }
        if ((aVar10 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                        )0x1) ||
           (JsonLexer::Expect(lex,field,1,":"), (lex->stream_).stream_ != (ZeroCopyInputStream *)0x1
           )) goto LAB_002c5583;
        if (local_130 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_130.status_);
          uVar13 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_190.status_);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
          ~StatusOrData((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                         *)&local_190.status_);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_130.status_);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_158);
          _Unwind_Resume(uVar13);
        }
        piVar1 = (int *)(*(size_t *)
                          ((long)&((field[4].pool_)->messages_).
                                  super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                  .
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          + 8) - 8);
        *piVar1 = *piVar1 + 1;
        local_d8.heap =
             (HeapPtrs)MaybeOwnedString::AsView((MaybeOwnedString *)&local_128[0].status_);
        local_1b0._M_dataplus._M_p = local_158;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::EmplaceDecomposable::operator()
                  (&local_48,&local_1b0,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_d8.heap,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_d8);
        if (local_48.second == false) {
          local_178._16_16_ =
               (undefined1  [16])MaybeOwnedString::AsView((MaybeOwnedString *)&local_128[0].status_)
          ;
          local_1b0._M_string_length =
               (size_type)
               absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          in_R8 = (char *)0x1;
          local_1b0._M_dataplus._M_p = (pointer)this;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_d8,"got unexpectedly-repeated repeated map key: \'%s\'",0x30,&local_1b0)
          ;
          JsonLocation::Invalid
                    ((JsonLocation *)lex,local_f8,local_d8.heap.slot_array.p,local_d8.heap.control);
          if ((ZeroCopyInputStream *)local_d8.heap.control != local_c8) {
            operator_delete(local_d8.heap.control,(long)local_c8[0]._vptr_ZeroCopyInputStream + 1);
          }
        }
        else {
          uVar14 = *(ulong *)((msg->stream_).impl_.buffer_end_ + 0x30);
          local_178._0_8_ = local_128;
          local_178._8_8_ = field;
          ParseProto3Type::RecordAsSeen((Field)msg,in_RCX);
          url._M_str = *(char **)((uVar14 & 0xfffffffffffffffc) + 8);
          url._M_len = **(size_t **)(msg->stream_).impl_.buffer_;
          ResolverPool::FindMessage((ResolverPool *)&local_190.status_,url);
          (lex->stream_).stream_ = (ZeroCopyInputStream *)local_190;
          if (((ulong)local_190 & 1) == 0) {
            LOCK();
            *(int *)local_190 = *(int *)local_190 + 1;
            UNLOCK();
          }
          if (local_190 ==
              (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
               )0x1) {
            local_180 = local_188;
            puVar3 = (msg->stream_).impl_.buffer_end_;
            if (*(int *)(puVar3 + 0x48) == 10) {
              iVar2 = *(int *)(puVar3 + 0x50);
              pbVar12 = (in_RCX->stream_).cur_;
              if ((in_RCX->stream_).impl_.end_ <= pbVar12) {
                pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback
                                    ((EpsCopyOutputStream *)in_RCX,pbVar12);
              }
              uVar14 = (ulong)(iVar2 * 8 + 3);
              if (0x7f < (uint)(iVar2 << 3)) {
                do {
                  uVar16 = (uint)uVar14;
                  *pbVar12 = (byte)uVar14 | 0x80;
                  uVar14 = uVar14 >> 7;
                  pbVar12 = pbVar12 + 1;
                } while (0x3fff < uVar16);
              }
              *pbVar12 = (byte)uVar14;
              (in_RCX->stream_).cur_ = pbVar12 + 1;
              ParseMap<google::protobuf::json_internal::ParseProto3Type>::anon_class_32_4_5119429f::
              operator()::anon_class_16_2_441bf789::operator()
                        ((anon_class_16_2_441bf789 *)lex,
                         (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_178,
                         local_180);
              if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                iVar2 = *(int *)((msg->stream_).impl_.buffer_end_ + 0x50);
                pbVar12 = (in_RCX->stream_).cur_;
                if ((in_RCX->stream_).impl_.end_ <= pbVar12) {
                  pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback
                                      ((EpsCopyOutputStream *)in_RCX,pbVar12);
                }
                uVar14 = (ulong)(iVar2 * 8 + 4);
                if (0x7f < (uint)(iVar2 << 3)) {
                  do {
                    uVar16 = (uint)uVar14;
                    *pbVar12 = (byte)uVar14 | 0x80;
                    uVar14 = uVar14 >> 7;
                    pbVar12 = pbVar12 + 1;
                  } while (0x3fff < uVar16);
                }
                *pbVar12 = (byte)uVar14;
                (in_RCX->stream_).cur_ = pbVar12 + 1;
                (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
              }
            }
            else {
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              local_1b0._M_string_length = 0;
              local_1b0.field_2._M_local_buf[0] = '\0';
              io::StringOutputStream::StringOutputStream(this,&local_1b0);
              ParseProto3Type::Msg::Msg((Msg *)&local_d8.heap,(ZeroCopyOutputStream *)this);
              ParseMap<google::protobuf::json_internal::ParseProto3Type>::anon_class_32_4_5119429f::
              operator()::anon_class_16_2_441bf789::operator()
                        ((anon_class_16_2_441bf789 *)lex,
                         (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_178,
                         local_180);
              if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                local_98 = io::EpsCopyOutputStream::Trim
                                     ((EpsCopyOutputStream *)&local_d8.heap,local_98);
                _Var4._M_p = local_1b0._M_dataplus._M_p;
                iVar11 = io::EpsCopyOutputStream::ByteCount
                                   ((EpsCopyOutputStream *)&local_d8.heap,local_98);
                x._M_str = in_R8;
                x._M_len = (size_t)_Var4._M_p;
                ParseProto3Type::SetString
                          ((ParseProto3Type *)msg,(Field)in_RCX,
                           (Msg *)(long)((int)iVar11 - local_90),x);
                (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
              }
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::~raw_hash_set(&local_68);
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::~raw_hash_set(&local_88);
              io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_d8.heap);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                         local_1b0.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
          ~StatusOrData((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                         *)&local_190.status_);
        }
        if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c5583;
        literal_00._M_str = ",";
        literal_00._M_len = 1;
        bVar6 = JsonLexer::Peek((JsonLexer *)field,literal_00);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_130.status_);
        literal_01._M_str = "}";
        literal_01._M_len = 1;
        bVar8 = JsonLexer::Peek((JsonLexer *)field,literal_01);
        if (bVar8) {
          piVar1 = (int *)((long)&field[2].parent_ + 4);
          *piVar1 = *piVar1 + 1;
          if ((!bVar6) || (*(char *)&field[2].type_ != '\0')) goto LAB_002c5095;
          pcVar15 = "expected \'}\'";
          goto LAB_002c5552;
        }
      } while (bVar6);
      pcVar15 = "expected \',\'";
LAB_002c5552:
      JsonLocation::Invalid((JsonLocation *)lex,field + 3,0xc,pcVar15);
    }
  }
LAB_002c5590:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_158);
  return (Status)extraout_RAX;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}